

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocale::toCurrencyString
          (QString *__return_storage_ptr__,QLocale *this,qlonglong value,QString *symbol)

{
  ushort uVar1;
  anon_union_24_3_e3d07ef4_for_data *paVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QLocalePrivate *pQVar8;
  QSystemLocale *pQVar9;
  quint16 *pqVar10;
  byte bVar11;
  QLocaleData *this_00;
  long in_FS_OFFSET;
  QAnyStringView pattern;
  CurrencyToStringArgument arg;
  QString local_f8;
  QString local_d8;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = (this->d).d.ptr;
  this_00 = pQVar8->m_data;
  if (this_00 == &systemLocaleData) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)&local_98,value);
    ::QVariant::QVariant((QVariant *)&local_78,(QVariant *)&local_98);
    local_58 = &((symbol->d).d)->super_QArrayData;
    pcStack_50 = (symbol->d).ptr;
    local_48 = (undefined1 *)(symbol->d).size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ::QVariant::~QVariant((QVariant *)&local_98);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = systemLocale();
    ::QVariant::QVariant((QVariant *)&local_b8,(QMetaType)0x6ae780,&local_78);
    (*pQVar9->_vptr_QSystemLocale[2])(&local_98,pQVar9,0x20,&local_b8);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_b8);
    lVar3 = (__return_storage_ptr__->d).size;
    if ((lVar3 == 0) && (pDVar4 = (__return_storage_ptr__->d).d, pDVar4 != (Data *)0x0)) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_78);
    if (lVar3 != 0) goto LAB_00313622;
    pQVar8 = (this->d).d.ptr;
    this_00 = pQVar8->m_data;
  }
  if ((value < 0) && (bVar11 = this_00->m_currencyFormatNegative_size, bVar11 != 0)) {
    pqVar10 = &this_00->m_currencyFormatNegative_idx;
    value = -value;
  }
  else {
    pqVar10 = &this_00->m_currencyFormat_idx;
    bVar11 = this_00->m_currencyFormat_size;
  }
  uVar1 = *pqVar10;
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLocaleData::longLongToString
            (&local_d8,this_00,value,-1,10,-1,
             (~(pQVar8->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
               super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5);
  local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  paVar2 = (anon_union_24_3_e3d07ef4_for_data *)(symbol->d).ptr;
  if (paVar2 == (anon_union_24_3_e3d07ef4_for_data *)0x0) {
    currencySymbol(&local_f8,this,CurrencySymbol);
  }
  else {
    local_f8.d.d = (symbol->d).d;
    local_f8.d.size = (symbol->d).size;
    local_f8.d.ptr = (char16_t *)paVar2;
    if ((anon_union_24_3_e3d07ef4_for_data *)local_f8.d.d !=
        (anon_union_24_3_e3d07ef4_for_data *)0x0) {
      LOCK();
      *(int *)local_f8.d.d = *(int *)local_f8.d.d + 1;
      UNLOCK();
    }
  }
  if ((undefined1 *)local_f8.d.size == (undefined1 *)0x0) {
    currencySymbol((QString *)&local_78,this,CurrencyIsoCode);
    uVar7 = local_78._16_8_;
    uVar6 = local_78.shared;
    pcVar5 = local_f8.d.ptr;
    pDVar4 = local_f8.d.d;
    local_78.shared = (PrivateShared *)local_f8.d.d;
    local_f8.d.d = (Data *)uVar6;
    local_f8.d.ptr = (char16_t *)local_78._8_8_;
    local_78._8_8_ = pcVar5;
    local_78._16_8_ = local_f8.d.size;
    local_f8.d.size = uVar7;
    if ((anon_union_24_3_e3d07ef4_for_data *)pDVar4 != (anon_union_24_3_e3d07ef4_for_data *)0x0) {
      LOCK();
      *(int *)pDVar4 = *(int *)pDVar4 + -1;
      UNLOCK();
      if (*(int *)pDVar4 == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
      }
    }
  }
  pattern.field_0.m_data = (void *)((ulong)bVar11 | 0x8000000000000000);
  local_98._16_8_ = local_d8.d.size | 0x8000000000000000;
  local_78.shared = (PrivateShared *)&local_98;
  local_98.data[0] = '\x01';
  local_98._8_8_ = local_d8.d.ptr;
  local_b8._16_8_ = local_f8.d.size | 0x8000000000000000;
  local_78._8_8_ = &local_b8;
  local_b8.data[0] = '\x01';
  local_b8._8_8_ = local_f8.d.ptr;
  local_78._16_8_ = (undefined1 *)0x0;
  pattern.m_size = 2;
  QtPrivate::argToQString
            (__return_storage_ptr__,
             (QtPrivate *)
             (
             L"%1%2%1\xa0%2(%2%1)%2\xa0%1(%1\xa0%2)\x200f%1\xa0%2\x061c%1%2(\x061c%1%2)(%1%2)(%1)\xa0%2(%2\xa0%1)%2-%1%1\x202f%2\x200f%1\xa0\x200f%2\x200f\x200e-%1\xa0\x200f%2%2\xa0-%1%2−%1%2-\xa0%1\x200e%2\xa0%1\x200e(%2\xa0%1)"
             + uVar1),pattern,(size_t)&local_78,(ArgBase **)local_78.shared);
  if ((anon_union_24_3_e3d07ef4_for_data *)local_f8.d.d != (anon_union_24_3_e3d07ef4_for_data *)0x0)
  {
    LOCK();
    *(int *)local_f8.d.d = *(int *)local_f8.d.d + -1;
    UNLOCK();
    if (*(int *)local_f8.d.d == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00313622:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::toCurrencyString(qlonglong value, const QString &symbol) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QLocaleData::DataRange range = d->m_data->currencyFormatNegative();
    if (!range.size || value >= 0)
        range = d->m_data->currencyFormat();
    else
        value = -value;
    QString str = toString(value);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return range.viewData(currency_format_data).arg(str, sym);
}